

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::GridSample_x86_avx512::forward
          (GridSample_x86_avx512 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float *pfVar1;
  undefined4 uVar2;
  float fVar3;
  float fVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  uint _elempack;
  Mat *src;
  Mat *this_00;
  size_t sVar9;
  int *piVar10;
  void *pvVar11;
  size_t sVar12;
  size_t sVar13;
  size_t sVar14;
  float fVar15;
  int iVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  int iVar20;
  int _h;
  __m512 afVar21;
  int iVar22;
  Option *opt_00;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  Allocator *pAVar26;
  Allocator *pAVar27;
  long lVar28;
  char *__ptr;
  undefined1 (*pauVar29) [64];
  undefined1 (*pauVar30) [32];
  undefined1 (*pauVar31) [16];
  void *pvVar32;
  int *offset_ptr;
  int iVar33;
  long lVar34;
  int i_1;
  undefined4 *puVar35;
  int i;
  bool bVar36;
  undefined1 auVar37 [64];
  undefined1 auVar42 [16];
  undefined1 auVar38 [64];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [64];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar49 [64];
  undefined1 auVar51 [16];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar55 [16];
  float fVar50;
  undefined1 auVar54 [64];
  undefined1 auVar56 [32];
  undefined1 auVar57 [64];
  undefined1 auVar59 [16];
  float fVar58;
  undefined1 auVar60 [32];
  undefined1 auVar61 [64];
  undefined1 auVar62 [16];
  undefined1 auVar63 [32];
  undefined1 auVar64 [64];
  float fVar65;
  undefined1 auVar66 [32];
  undefined1 auVar68 [16];
  undefined1 auVar67 [64];
  undefined1 auVar69 [32];
  undefined1 auVar70 [64];
  undefined1 auVar72 [16];
  float fVar71;
  undefined1 auVar73 [32];
  __m512 y_coeffs3;
  __m512 y_coeffs2;
  __m512 y_coeffs1;
  __m512 y_coeffs0;
  __m512 x_coeffs3;
  __m512 x_coeffs2;
  __m512 x_coeffs1;
  __m512 x_coeffs0;
  __m512 value_f [4];
  size_t sStackY_4c8;
  undefined1 local_440 [32];
  Allocator *local_420;
  int iStack_418;
  int iStack_414;
  size_t sStack_410;
  int local_408;
  size_t local_400;
  undefined8 local_3f8;
  Mat local_3f0;
  Allocator *local_3a0;
  Allocator *local_398;
  float local_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  float local_380;
  undefined1 auStack_37c [12];
  undefined1 auStack_370 [16];
  undefined1 auStack_360 [32];
  float local_340;
  undefined1 auStack_33c [12];
  undefined1 auStack_330 [16];
  undefined1 auStack_320 [32];
  float local_300;
  undefined1 auStack_2fc [12];
  undefined1 auStack_2f0 [16];
  undefined1 auStack_2e0 [32];
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  undefined1 auStack_2a4 [36];
  float local_280;
  undefined1 auStack_27c [12];
  undefined1 auStack_270 [16];
  undefined1 auStack_260 [32];
  float local_240;
  undefined1 auStack_23c [12];
  undefined1 auStack_230 [16];
  undefined1 auStack_220 [32];
  float local_200;
  undefined1 auStack_1fc [12];
  undefined1 auStack_1f0 [16];
  undefined1 auStack_1e0 [32];
  float local_1c0;
  float fStack_1bc;
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  undefined1 auStack_1a4 [36];
  undefined1 local_180 [20];
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  undefined1 auStack_160 [32];
  undefined1 local_140 [32];
  undefined1 auStack_120 [32];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  src = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
        super__Vector_impl_data._M_start;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  _elempack = src->elempack;
  iVar22 = src->c;
  iVar33 = src->dims;
  sVar9 = src->elemsize;
  local_400 = 0;
  local_440._0_8_ = (Allocator *)0x0;
  local_440._8_4_ = 0;
  local_440._12_4_ = 0;
  local_440._16_12_ = SUB1612(ZEXT816(0) << 0x40,4);
  local_3f0.cstep = 0;
  sStack_410 = SUB168(ZEXT816(0) << 0x40,4);
  local_408 = 0;
  local_3f0.h = 0;
  local_420 = (Allocator *)local_440._0_8_;
  iStack_418 = local_440._8_4_;
  iStack_414 = local_440._12_4_;
  local_3f0.data = (void *)local_440._0_8_;
  local_3f0.refcount._0_4_ = local_440._8_4_;
  local_3f0.refcount._4_4_ = local_440._12_4_;
  local_3f0.elemsize = sStack_410;
  local_3f0.elempack = local_408;
  local_3f0.allocator = (Allocator *)local_440._0_8_;
  local_3f0.dims = local_440._8_4_;
  local_3f0.w = local_440._12_4_;
  local_3f0.d = local_440._8_4_;
  local_3f0.c = local_408;
  if (src[1].elempack == 1) {
    if (&local_3f0 != src + 1) {
      piVar10 = src[1].refcount;
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + 1;
        UNLOCK();
      }
      local_3f0.data = src[1].data;
      local_3f0.refcount._0_4_ = (int)src[1].refcount;
      local_3f0.refcount._4_4_ = (int)((ulong)src[1].refcount >> 0x20);
      local_3f0.elemsize = src[1].elemsize;
      local_3f0.elempack = src[1].elempack;
      local_3f0.allocator = src[1].allocator;
      uVar5 = src[1].dims;
      uVar6 = src[1].w;
      uVar7 = src[1].h;
      uVar8 = src[1].d;
      local_3f0.c = src[1].c;
      local_3f0.cstep = src[1].cstep;
      local_3f0.dims = uVar5;
      local_3f0.w = uVar6;
      local_3f0.h = uVar7;
      local_3f0.d = uVar8;
    }
  }
  else {
    convert_packing(src + 1,&local_3f0,1,opt);
  }
  local_3f8 = 0xffffffffffffff9c;
  if (iVar33 == 3) {
    iVar16 = local_3f0.h;
    iVar20 = local_3f0.w;
    if ((this->super_GridSample).permute_fusion == 0) {
      iVar16 = local_3f0.c;
      iVar20 = local_3f0.h;
    }
    Mat::create(this_00,iVar20,iVar16,iVar22,sVar9,_elempack,opt->blob_allocator);
    if ((this_00->data == (void *)0x0) || ((long)this_00->c * this_00->cstep == 0))
    goto LAB_0052b005;
    iVar22 = (this->super_GridSample).sample_type;
    if (iVar22 == 1) {
      Mat::create((Mat *)local_440,iVar20,iVar16,sVar9 * 6,6,opt->workspace_allocator);
      if (((Allocator *)local_440._0_8_ == (Allocator *)0x0) || ((long)local_408 * local_400 == 0))
      goto LAB_0052b005;
      iVar22 = (this->super_GridSample).padding_mode;
      if (iVar22 == 3) {
        iVar22 = (this->super_GridSample).permute_fusion;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)3,false>
                    (src,&local_3f0,(Mat *)local_440,iVar22);
        }
        else {
          gridsample_2d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)3,true>
                    (src,&local_3f0,(Mat *)local_440,iVar22);
        }
LAB_005296c3:
        iVar22 = (this->super_GridSample).sample_type;
        goto LAB_005296ce;
      }
      if (iVar22 == 2) {
        iVar22 = (this->super_GridSample).permute_fusion;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)2,false>
                    (src,&local_3f0,(Mat *)local_440,iVar22);
        }
        else {
          gridsample_2d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)2,true>
                    (src,&local_3f0,(Mat *)local_440,iVar22);
        }
        goto LAB_005296c3;
      }
      if (iVar22 == 1) {
        iVar22 = (this->super_GridSample).permute_fusion;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)1,false>
                    (src,&local_3f0,(Mat *)local_440,iVar22);
        }
        else {
          gridsample_2d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)1,true>
                    (src,&local_3f0,(Mat *)local_440,iVar22);
        }
        goto LAB_005296c3;
      }
LAB_00529adc:
      __ptr = "gridsample padding_mode error\n";
      sStackY_4c8 = 0x1e;
LAB_0052aff1:
      fwrite(__ptr,sStackY_4c8,1,_stderr);
      fputc(10,_stderr);
      goto LAB_0052b005;
    }
LAB_005296ce:
    if (iVar22 == 2) {
      Mat::create((Mat *)local_440,iVar20,iVar16,1,sVar9,1,opt->workspace_allocator);
      if (((Allocator *)local_440._0_8_ == (Allocator *)0x0) || ((long)local_408 * local_400 == 0))
      goto LAB_0052b005;
      iVar22 = (this->super_GridSample).padding_mode;
      if (iVar22 == 3) {
        iVar22 = (this->super_GridSample).permute_fusion;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)3,false>
                    (src,&local_3f0,(Mat *)local_440,iVar22);
        }
        else {
          gridsample_2d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)3,true>
                    (src,&local_3f0,(Mat *)local_440,iVar22);
        }
      }
      else if (iVar22 == 2) {
        iVar22 = (this->super_GridSample).permute_fusion;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)2,false>
                    (src,&local_3f0,(Mat *)local_440,iVar22);
        }
        else {
          gridsample_2d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)2,true>
                    (src,&local_3f0,(Mat *)local_440,iVar22);
        }
      }
      else {
        if (iVar22 != 1) goto LAB_00529adc;
        iVar22 = (this->super_GridSample).permute_fusion;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)1,false>
                    (src,&local_3f0,(Mat *)local_440,iVar22);
        }
        else {
          gridsample_2d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)1,true>
                    (src,&local_3f0,(Mat *)local_440,iVar22);
        }
      }
    }
    if ((this->super_GridSample).sample_type == 3) {
      Mat::create((Mat *)local_440,iVar20,iVar16,sVar9 * 0x12,0x12,opt->workspace_allocator);
      if (((Allocator *)local_440._0_8_ == (Allocator *)0x0) || ((long)local_408 * local_400 == 0))
      goto LAB_0052b005;
      iVar22 = (this->super_GridSample).padding_mode;
      if (iVar22 == 3) {
        iVar22 = (this->super_GridSample).permute_fusion;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_bicubic_compute_blob<(ncnn::GridSample::PaddingMode)3,false>
                    (src,&local_3f0,(Mat *)local_440,iVar22);
        }
        else {
          gridsample_2d_bicubic_compute_blob<(ncnn::GridSample::PaddingMode)3,true>
                    (src,&local_3f0,(Mat *)local_440,iVar22);
        }
      }
      else if (iVar22 == 2) {
        iVar22 = (this->super_GridSample).permute_fusion;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_bicubic_compute_blob<(ncnn::GridSample::PaddingMode)2,false>
                    (src,&local_3f0,(Mat *)local_440,iVar22);
        }
        else {
          gridsample_2d_bicubic_compute_blob<(ncnn::GridSample::PaddingMode)2,true>
                    (src,&local_3f0,(Mat *)local_440,iVar22);
        }
      }
      else {
        if (iVar22 != 1) goto LAB_00529adc;
        iVar22 = (this->super_GridSample).permute_fusion;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_2d_bicubic_compute_blob<(ncnn::GridSample::PaddingMode)1,false>
                    (src,&local_3f0,(Mat *)local_440,iVar22);
        }
        else {
          gridsample_2d_bicubic_compute_blob<(ncnn::GridSample::PaddingMode)1,true>
                    (src,&local_3f0,(Mat *)local_440,iVar22);
        }
      }
    }
LAB_00529b52:
    bVar36 = false;
  }
  else {
    if (iVar33 != 4) goto LAB_00529b52;
    iVar16 = local_3f0.d;
    iVar20 = local_3f0.w;
    _h = local_3f0.h;
    if ((this->super_GridSample).permute_fusion == 0) {
      iVar16 = local_3f0.c;
      iVar20 = local_3f0.h;
      _h = local_3f0.d;
    }
    Mat::create(this_00,iVar20,_h,iVar16,iVar22,sVar9,_elempack,opt->blob_allocator);
    if ((this_00->data == (void *)0x0) || ((long)this_00->c * this_00->cstep == 0))
    goto LAB_0052b005;
    iVar22 = (this->super_GridSample).sample_type;
    if (iVar22 == 1) {
      Mat::create((Mat *)local_440,iVar20,_h,iVar16,sVar9 * 0xb,0xb,opt->workspace_allocator);
      if (((Allocator *)local_440._0_8_ == (Allocator *)0x0) || ((long)local_408 * local_400 == 0))
      goto LAB_0052b005;
      iVar22 = (this->super_GridSample).padding_mode;
      if (iVar22 == 3) {
        iVar22 = (this->super_GridSample).permute_fusion;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_3d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)3,false>
                    (src,&local_3f0,(Mat *)local_440,iVar22);
        }
        else {
          gridsample_3d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)3,true>
                    (src,&local_3f0,(Mat *)local_440,iVar22);
        }
      }
      else if (iVar22 == 2) {
        iVar22 = (this->super_GridSample).permute_fusion;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_3d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)2,false>
                    (src,&local_3f0,(Mat *)local_440,iVar22);
        }
        else {
          gridsample_3d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)2,true>
                    (src,&local_3f0,(Mat *)local_440,iVar22);
        }
      }
      else {
        if (iVar22 != 1) goto LAB_00529adc;
        iVar22 = (this->super_GridSample).permute_fusion;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_3d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)1,false>
                    (src,&local_3f0,(Mat *)local_440,iVar22);
        }
        else {
          gridsample_3d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)1,true>
                    (src,&local_3f0,(Mat *)local_440,iVar22);
        }
      }
      iVar22 = (this->super_GridSample).sample_type;
    }
    if (iVar22 == 2) {
      Mat::create((Mat *)local_440,iVar20,_h,iVar16,1,sVar9,1,opt->workspace_allocator);
      if (((Allocator *)local_440._0_8_ == (Allocator *)0x0) || ((long)local_408 * local_400 == 0))
      goto LAB_0052b005;
      iVar22 = (this->super_GridSample).padding_mode;
      if (iVar22 == 3) {
        iVar22 = (this->super_GridSample).permute_fusion;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_3d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)3,false>
                    (src,&local_3f0,(Mat *)local_440,iVar22);
        }
        else {
          gridsample_3d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)3,true>
                    (src,&local_3f0,(Mat *)local_440,iVar22);
        }
      }
      else if (iVar22 == 2) {
        iVar22 = (this->super_GridSample).permute_fusion;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_3d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)2,false>
                    (src,&local_3f0,(Mat *)local_440,iVar22);
        }
        else {
          gridsample_3d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)2,true>
                    (src,&local_3f0,(Mat *)local_440,iVar22);
        }
      }
      else {
        if (iVar22 != 1) goto LAB_00529adc;
        iVar22 = (this->super_GridSample).permute_fusion;
        if ((this->super_GridSample).align_corner == 0) {
          gridsample_3d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)1,false>
                    (src,&local_3f0,(Mat *)local_440,iVar22);
        }
        else {
          gridsample_3d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)1,true>
                    (src,&local_3f0,(Mat *)local_440,iVar22);
        }
      }
    }
    bVar36 = true;
    if ((this->super_GridSample).sample_type == 3) {
      __ptr = "unsupported bicubic when dims == 4";
      sStackY_4c8 = 0x22;
      goto LAB_0052aff1;
    }
  }
  opt_00 = (Option *)(ulong)_elempack;
  local_3f8 = 0;
  if (_elempack != 1) {
    if (_elempack != 4) {
      if (_elempack != 8) {
        if (_elempack != 0x10) goto LAB_0052b005;
        if (iVar33 == 3) {
          iVar22 = (this->super_GridSample).sample_type;
          if (iVar22 == 3) {
            iVar22 = this_00->h * this_00->w;
            if (iVar22 < 1) {
              iVar22 = 0;
            }
            local_3f8 = 0;
            uVar23 = (ulong)(uint)this_00->c;
            if (this_00->c < 1) {
              uVar23 = 0;
            }
            for (uVar25 = 0; uVar25 != uVar23; uVar25 = uVar25 + 1) {
              lVar28 = src->cstep * uVar25 * src->elemsize;
              pvVar11 = src->data;
              pauVar29 = (undefined1 (*) [64])
                         (this_00->cstep * uVar25 * this_00->elemsize + (long)this_00->data);
              pAVar26 = (Allocator *)local_440._0_8_;
              for (iVar33 = 0; iVar33 != iVar22; iVar33 = iVar33 + 1) {
                _local_180 = (__m512)vbroadcastss_avx512f
                                               (ZEXT416(*(uint *)&pAVar26->_vptr_Allocator));
                cubic_interp1d_p16((__m512 *)&local_1c0,(__m512 *)&local_200,(__m512 *)&local_240,
                                   (__m512 *)&local_280,(__m512 *)local_180);
                _local_180 = (__m512)vbroadcastss_avx512f
                                               (ZEXT416(*(uint *)((long)&pAVar26->_vptr_Allocator +
                                                                 4)));
                cubic_interp1d_p16((__m512 *)&local_2c0,(__m512 *)&local_300,(__m512 *)&local_340,
                                   (__m512 *)&local_380,(__m512 *)local_180);
                auVar57._4_4_ = fStack_1bc;
                auVar57._0_4_ = local_1c0;
                auVar57._8_4_ = fStack_1b8;
                auVar57._12_4_ = fStack_1b4;
                auVar57._16_4_ = fStack_1b0;
                auVar57._20_4_ = fStack_1ac;
                auVar57._24_4_ = fStack_1a8;
                auVar57._28_36_ = auStack_1a4;
                auVar54._4_12_ = auStack_1fc;
                auVar54._0_4_ = local_200;
                auVar54._16_16_ = auStack_1f0;
                auVar54._32_32_ = auStack_1e0;
                auVar41._4_12_ = auStack_23c;
                auVar41._0_4_ = local_240;
                auVar41._16_16_ = auStack_230;
                auVar41._32_32_ = auStack_220;
                auVar49._4_12_ = auStack_27c;
                auVar49._0_4_ = local_280;
                auVar49._16_16_ = auStack_270;
                auVar49._32_32_ = auStack_260;
                for (lVar34 = 0; lVar34 != 0x40; lVar34 = lVar34 + 0x10) {
                  lVar24 = (long)*(int *)((long)&pAVar26[1]._vptr_Allocator + lVar34);
                  auVar61 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar37 = ZEXT1664(ZEXT816(0) << 0x40);
                  if (-1 < lVar24) {
                    auVar37 = *(undefined1 (*) [64])((long)pvVar11 + lVar24 * 4 + lVar28);
                  }
                  lVar24 = (long)*(int *)((long)&pAVar26[1]._vptr_Allocator + lVar34 + 4);
                  if (-1 < lVar24) {
                    auVar61 = *(undefined1 (*) [64])((long)pvVar11 + lVar24 * 4 + lVar28);
                  }
                  lVar24 = (long)*(int *)((long)&pAVar26[2]._vptr_Allocator + lVar34);
                  auVar70 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar67 = ZEXT1664(ZEXT816(0) << 0x40);
                  if (-1 < lVar24) {
                    auVar67 = *(undefined1 (*) [64])((long)pvVar11 + lVar24 * 4 + lVar28);
                  }
                  lVar24 = (long)*(int *)((long)&pAVar26[2]._vptr_Allocator + lVar34 + 4);
                  if (-1 < lVar24) {
                    auVar70 = *(undefined1 (*) [64])((long)pvVar11 + lVar24 * 4 + lVar28);
                  }
                  auVar37 = vmulps_avx512f(auVar37,auVar57);
                  auVar37 = vfmadd213ps_avx512f(auVar61,auVar54,auVar37);
                  auVar37 = vfmadd213ps_avx512f(auVar67,auVar41,auVar37);
                  auVar37 = vfmadd231ps_avx512f(auVar37,auVar49,auVar70);
                  *(undefined1 (*) [64])(local_180 + lVar34 * 4) = auVar37;
                }
                auVar70._4_4_ = fStack_2bc;
                auVar70._0_4_ = local_2c0;
                auVar70._8_4_ = fStack_2b8;
                auVar70._12_4_ = fStack_2b4;
                auVar70._16_4_ = fStack_2b0;
                auVar70._20_4_ = fStack_2ac;
                auVar70._24_4_ = fStack_2a8;
                auVar70._28_36_ = auStack_2a4;
                auVar49 = vmulps_avx512f((undefined1  [64])_local_180,auVar70);
                auVar67._4_12_ = auStack_2fc;
                auVar67._0_4_ = local_300;
                auVar67._16_16_ = auStack_2f0;
                auVar67._32_32_ = auStack_2e0;
                auVar38._32_32_ = auStack_120;
                auVar38._0_32_ = local_140;
                auVar49 = vfmadd132ps_avx512f(auVar67,auVar49,auVar38);
                auVar61._4_12_ = auStack_33c;
                auVar61._0_4_ = local_340;
                auVar61._16_16_ = auStack_330;
                auVar61._32_32_ = auStack_320;
                auVar49 = vfmadd132ps_avx512f(auVar61,auVar49,local_100);
                auVar37._4_12_ = auStack_37c;
                auVar37._0_4_ = local_380;
                auVar37._16_16_ = auStack_370;
                auVar37._32_32_ = auStack_360;
                auVar49 = vfmadd132ps_avx512f(auVar37,auVar49,local_c0);
                *pauVar29 = auVar49;
                pauVar29 = pauVar29 + 1;
                pAVar26 = pAVar26 + 9;
              }
            }
            goto LAB_0052b005;
          }
          if (iVar22 != 2) {
            if (iVar22 == 1) {
              iVar22 = this_00->h * this_00->w;
              if (iVar22 < 1) {
                iVar22 = 0;
              }
              local_3f8 = 0;
              uVar23 = (ulong)(uint)this_00->c;
              if (this_00->c < 1) {
                uVar23 = 0;
              }
              for (uVar25 = 0; uVar25 != uVar23; uVar25 = uVar25 + 1) {
                lVar28 = src->cstep * uVar25 * src->elemsize;
                pvVar11 = src->data;
                pauVar29 = (undefined1 (*) [64])
                           (this_00->cstep * uVar25 * this_00->elemsize + (long)this_00->data);
                pAVar26 = (Allocator *)local_440._0_8_;
                iVar33 = iVar22;
                while (bVar36 = iVar33 != 0, iVar33 = iVar33 + -1, bVar36) {
                  auVar41 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar49 = ZEXT1664(ZEXT816(0) << 0x40);
                  if (-1 < (long)*(int *)&pAVar26->_vptr_Allocator) {
                    auVar49 = *(undefined1 (*) [64])
                               ((long)pvVar11 + (long)*(int *)&pAVar26->_vptr_Allocator * 4 + lVar28
                               );
                  }
                  lVar34 = (long)*(int *)((long)&pAVar26->_vptr_Allocator + 4);
                  if (-1 < lVar34) {
                    auVar41 = *(undefined1 (*) [64])((long)pvVar11 + lVar34 * 4 + lVar28);
                  }
                  auVar57 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar54 = ZEXT1664(ZEXT816(0) << 0x40);
                  if (-1 < (long)*(int *)&pAVar26[1]._vptr_Allocator) {
                    auVar54 = *(undefined1 (*) [64])
                               ((long)pvVar11 +
                               (long)*(int *)&pAVar26[1]._vptr_Allocator * 4 + lVar28);
                  }
                  lVar34 = (long)*(int *)((long)&pAVar26[1]._vptr_Allocator + 4);
                  if (-1 < lVar34) {
                    auVar57 = *(undefined1 (*) [64])((long)pvVar11 + lVar34 * 4 + lVar28);
                  }
                  auVar37 = vbroadcastss_avx512f(ZEXT416(*(uint *)&pAVar26[2]._vptr_Allocator));
                  auVar49 = vfmsub231ps_avx512f(auVar49,auVar37,auVar49);
                  auVar49 = vfmsub213ps_avx512f(auVar41,auVar37,auVar49);
                  auVar41 = vfmsub231ps_avx512f(auVar54,auVar37,auVar54);
                  auVar41 = vfnmadd231ps_avx512f(auVar41,auVar37,auVar57);
                  auVar54 = vbroadcastss_avx512f
                                      (ZEXT416(*(uint *)((long)&pAVar26[2]._vptr_Allocator + 4)));
                  auVar49 = vfmsub231ps_avx512f(auVar49,auVar54,auVar49);
                  auVar49 = vfnmsub231ps_avx512f(auVar49,auVar54,auVar41);
                  *pauVar29 = auVar49;
                  pauVar29 = pauVar29 + 1;
                  pAVar26 = pAVar26 + 3;
                }
              }
            }
            goto LAB_0052b005;
          }
        }
        else {
          if (!bVar36) goto LAB_0052b005;
          iVar22 = (this->super_GridSample).sample_type;
          if (iVar22 != 2) {
            if (iVar22 == 1) {
              iVar22 = this_00->h * this_00->w * this_00->d;
              if (iVar22 < 1) {
                iVar22 = 0;
              }
              local_3f8 = 0;
              uVar23 = (ulong)(uint)this_00->c;
              if (this_00->c < 1) {
                uVar23 = 0;
              }
              for (uVar25 = 0; uVar25 != uVar23; uVar25 = uVar25 + 1) {
                lVar28 = src->cstep * uVar25 * src->elemsize;
                pvVar11 = src->data;
                pauVar29 = (undefined1 (*) [64])
                           (this_00->cstep * uVar25 * this_00->elemsize + (long)this_00->data);
                pAVar26 = (Allocator *)local_440._0_8_;
                iVar33 = iVar22;
                while (bVar36 = iVar33 != 0, iVar33 = iVar33 + -1, bVar36) {
                  auVar41 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar49 = ZEXT1664(ZEXT816(0) << 0x40);
                  if (-1 < (long)*(int *)&pAVar26->_vptr_Allocator) {
                    auVar49 = *(undefined1 (*) [64])
                               ((long)pvVar11 + (long)*(int *)&pAVar26->_vptr_Allocator * 4 + lVar28
                               );
                  }
                  lVar34 = (long)*(int *)((long)&pAVar26->_vptr_Allocator + 4);
                  if (-1 < lVar34) {
                    auVar41 = *(undefined1 (*) [64])((long)pvVar11 + lVar34 * 4 + lVar28);
                  }
                  auVar57 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar54 = ZEXT1664(ZEXT816(0) << 0x40);
                  if (-1 < (long)*(int *)&pAVar26[1]._vptr_Allocator) {
                    auVar54 = *(undefined1 (*) [64])
                               ((long)pvVar11 +
                               (long)*(int *)&pAVar26[1]._vptr_Allocator * 4 + lVar28);
                  }
                  lVar34 = (long)*(int *)((long)&pAVar26[1]._vptr_Allocator + 4);
                  if (-1 < lVar34) {
                    auVar57 = *(undefined1 (*) [64])((long)pvVar11 + lVar34 * 4 + lVar28);
                  }
                  auVar61 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar37 = ZEXT1664(ZEXT816(0) << 0x40);
                  if (-1 < (long)*(int *)&pAVar26[2]._vptr_Allocator) {
                    auVar37 = *(undefined1 (*) [64])
                               ((long)pvVar11 +
                               (long)*(int *)&pAVar26[2]._vptr_Allocator * 4 + lVar28);
                  }
                  lVar34 = (long)*(int *)((long)&pAVar26[2]._vptr_Allocator + 4);
                  if (-1 < lVar34) {
                    auVar61 = *(undefined1 (*) [64])((long)pvVar11 + lVar34 * 4 + lVar28);
                  }
                  auVar70 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar67 = ZEXT1664(ZEXT816(0) << 0x40);
                  if (-1 < (long)*(int *)&pAVar26[3]._vptr_Allocator) {
                    auVar67 = *(undefined1 (*) [64])
                               ((long)pvVar11 +
                               (long)*(int *)&pAVar26[3]._vptr_Allocator * 4 + lVar28);
                  }
                  lVar34 = (long)*(int *)((long)&pAVar26[3]._vptr_Allocator + 4);
                  if (-1 < lVar34) {
                    auVar70 = *(undefined1 (*) [64])((long)pvVar11 + lVar34 * 4 + lVar28);
                  }
                  auVar38 = vbroadcastss_avx512f(ZEXT416(*(uint *)&pAVar26[4]._vptr_Allocator));
                  auVar49 = vfmsub231ps_avx512f(auVar49,auVar38,auVar49);
                  auVar49 = vfmsub213ps_avx512f(auVar41,auVar38,auVar49);
                  auVar41 = vfmsub231ps_avx512f(auVar54,auVar38,auVar54);
                  auVar41 = vfnmadd213ps_avx512f(auVar57,auVar38,auVar41);
                  auVar54 = vfmsub231ps_avx512f(auVar37,auVar38,auVar37);
                  auVar54 = vfmsub213ps_avx512f(auVar61,auVar38,auVar54);
                  auVar57 = vfmsub231ps_avx512f(auVar67,auVar38,auVar67);
                  auVar37 = vbroadcastss_avx512f
                                      (ZEXT416(*(uint *)((long)&pAVar26[4]._vptr_Allocator + 4)));
                  auVar57 = vfnmadd231ps_avx512f(auVar57,auVar38,auVar70);
                  auVar49 = vfmsub231ps_avx512f(auVar49,auVar37,auVar49);
                  auVar49 = vfnmsub231ps_avx512f(auVar49,auVar37,auVar41);
                  auVar41 = vfmsub231ps_avx512f(auVar54,auVar37,auVar54);
                  auVar41 = vfmadd231ps_avx512f(auVar41,auVar37,auVar57);
                  auVar54 = vbroadcastss_avx512f(ZEXT416(*(uint *)&pAVar26[5]._vptr_Allocator));
                  auVar49 = vfmsub231ps_avx512f(auVar49,auVar54,auVar49);
                  auVar49 = vfnmsub231ps_avx512f(auVar49,auVar54,auVar41);
                  *pauVar29 = auVar49;
                  pauVar29 = pauVar29 + 1;
                  pAVar26 = (Allocator *)((long)&pAVar26[5]._vptr_Allocator + 4);
                }
              }
            }
            goto LAB_0052b005;
          }
        }
        gridsample_nearest_apply_interpolation_p16(src,this_00,(Mat *)local_440,opt_00);
        goto LAB_0052b005;
      }
      if (iVar33 == 3) {
        iVar22 = (this->super_GridSample).sample_type;
        if (iVar22 == 3) {
          iVar22 = this_00->h * this_00->w;
          pAVar26 = (Allocator *)0x0;
          if (iVar22 < 1) {
            iVar22 = 0;
          }
          local_398 = (Allocator *)(ulong)(uint)this_00->c;
          if (this_00->c < 1) {
            local_398 = pAVar26;
          }
          while (pAVar26 != local_398) {
            lVar28 = src->cstep * (long)pAVar26 * src->elemsize;
            pvVar11 = src->data;
            pauVar30 = (undefined1 (*) [32])
                       (this_00->cstep * (long)pAVar26 * this_00->elemsize + (long)this_00->data);
            pAVar27 = (Allocator *)local_440._0_8_;
            local_3a0 = pAVar26;
            for (iVar33 = 0; afVar21 = _local_180, iVar33 != iVar22; iVar33 = iVar33 + 1) {
              local_180._4_4_ = *(undefined4 *)&pAVar27->_vptr_Allocator;
              local_180._0_4_ = local_180._4_4_;
              local_180._8_4_ = local_180._4_4_;
              local_180._12_4_ = local_180._4_4_;
              local_180._16_4_ = local_180._4_4_;
              fStack_16c = (float)local_180._4_4_;
              fStack_168 = (float)local_180._4_4_;
              auStack_160 = afVar21._32_32_;
              fStack_164 = (float)local_180._4_4_;
              cubic_interp1d_p8((__m256 *)&local_1c0,(__m256 *)&local_200,(__m256 *)&local_240,
                                (__m256 *)&local_280,(__m256 *)local_180);
              local_180._4_4_ = *(float *)((long)&pAVar27->_vptr_Allocator + 4);
              local_180._0_4_ = local_180._4_4_;
              local_180._8_4_ = local_180._4_4_;
              local_180._12_4_ = local_180._4_4_;
              local_180._16_4_ = local_180._4_4_;
              fStack_16c = (float)local_180._4_4_;
              fStack_168 = (float)local_180._4_4_;
              fStack_164 = (float)local_180._4_4_;
              cubic_interp1d_p8((__m256 *)&local_2c0,(__m256 *)&local_300,(__m256 *)&local_340,
                                (__m256 *)&local_380,(__m256 *)local_180);
              auVar63._4_12_ = auStack_1fc;
              auVar63._0_4_ = local_200;
              auVar63._16_16_ = auStack_1f0;
              auVar53._4_12_ = auStack_23c;
              auVar53._0_4_ = local_240;
              auVar53._16_16_ = auStack_230;
              auVar52._4_12_ = auStack_27c;
              auVar52._0_4_ = local_280;
              auVar52._16_16_ = auStack_270;
              for (lVar34 = 0; lVar34 != 0x40; lVar34 = lVar34 + 0x10) {
                lVar24 = (long)*(int *)((long)&pAVar27[1]._vptr_Allocator + lVar34);
                auVar47 = ZEXT832(0) << 0x40;
                auVar49 = ZEXT1664(ZEXT816(0) << 0x40);
                if (-1 < lVar24) {
                  auVar49 = ZEXT3264(*(undefined1 (*) [32])((long)pvVar11 + lVar24 * 4 + lVar28));
                }
                lVar24 = (long)*(int *)((long)&pAVar27[1]._vptr_Allocator + lVar34 + 4);
                if (-1 < lVar24) {
                  auVar47 = *(undefined1 (*) [32])((long)pvVar11 + lVar24 * 4 + lVar28);
                }
                lVar24 = (long)*(int *)((long)&pAVar27[2]._vptr_Allocator + lVar34);
                auVar56 = ZEXT1632(ZEXT816(0) << 0x40);
                auVar48 = ZEXT832(0) << 0x40;
                if (-1 < lVar24) {
                  auVar48 = *(undefined1 (*) [32])((long)pvVar11 + lVar24 * 4 + lVar28);
                }
                lVar24 = (long)*(int *)((long)&pAVar27[2]._vptr_Allocator + lVar34 + 4);
                if (-1 < lVar24) {
                  auVar56 = *(undefined1 (*) [32])((long)pvVar11 + lVar24 * 4 + lVar28);
                }
                auVar64._0_4_ = auVar49._0_4_ * local_1c0;
                auVar64._4_4_ = auVar49._4_4_ * fStack_1bc;
                auVar64._8_4_ = auVar49._8_4_ * fStack_1b8;
                auVar64._12_4_ = auVar49._12_4_ * fStack_1b4;
                auVar64._16_4_ = auVar49._16_4_ * fStack_1b0;
                auVar64._20_4_ = auVar49._20_4_ * fStack_1ac;
                auVar64._28_36_ = auVar49._28_36_;
                auVar64._24_4_ = auVar49._24_4_ * fStack_1a8;
                auVar42 = vfmadd213ps_fma(auVar47,auVar63,auVar64._0_32_);
                auVar42 = vfmadd213ps_fma(auVar48,auVar53,ZEXT1632(auVar42));
                auVar42 = vfmadd231ps_fma(ZEXT1632(auVar42),auVar52,auVar56);
                *(undefined1 (*) [32])(local_180 + lVar34 * 2) = ZEXT1632(auVar42);
              }
              auVar56._4_4_ = (float)local_180._4_4_ * fStack_2bc;
              auVar56._0_4_ = (float)local_180._0_4_ * local_2c0;
              auVar56._8_4_ = (float)local_180._8_4_ * fStack_2b8;
              auVar56._12_4_ = (float)local_180._12_4_ * fStack_2b4;
              auVar56._16_4_ = (float)local_180._16_4_ * fStack_2b0;
              auVar56._20_4_ = fStack_16c * fStack_2ac;
              auVar56._24_4_ = fStack_168 * fStack_2a8;
              auVar56._28_4_ = fStack_164;
              auVar19._4_12_ = auStack_2fc;
              auVar19._0_4_ = local_300;
              auVar19._16_16_ = auStack_2f0;
              auVar42 = vfmadd132ps_fma(auVar19,auVar56,auStack_160);
              auVar69._4_12_ = auStack_33c;
              auVar69._0_4_ = local_340;
              auVar69._16_16_ = auStack_330;
              auVar42 = vfmadd132ps_fma(auVar69,ZEXT1632(auVar42),local_140);
              auVar66._4_12_ = auStack_37c;
              auVar66._0_4_ = local_380;
              auVar66._16_16_ = auStack_370;
              auVar42 = vfmadd132ps_fma(auVar66,ZEXT1632(auVar42),auStack_120);
              *pauVar30 = ZEXT1632(auVar42);
              pauVar30 = pauVar30 + 1;
              pAVar27 = pAVar27 + 9;
            }
            pAVar26 = (Allocator *)((long)&local_3a0->_vptr_Allocator + 1);
          }
          goto LAB_0052b005;
        }
        if (iVar22 != 2) {
          if (iVar22 == 1) {
            iVar22 = this_00->h * this_00->w;
            uVar23 = 0;
            if (iVar22 < 1) {
              iVar22 = 0;
            }
            uVar25 = (ulong)(uint)this_00->c;
            if (this_00->c < 1) {
              uVar25 = uVar23;
            }
            for (; uVar23 != uVar25; uVar23 = uVar23 + 1) {
              lVar28 = src->cstep * uVar23 * src->elemsize;
              pvVar11 = src->data;
              pauVar30 = (undefined1 (*) [32])
                         (this_00->cstep * uVar23 * this_00->elemsize + (long)this_00->data);
              pAVar26 = (Allocator *)local_440._0_8_;
              iVar33 = iVar22;
              while (bVar36 = iVar33 != 0, iVar33 = iVar33 + -1, bVar36) {
                auVar48 = ZEXT832(0) << 0x40;
                auVar47 = ZEXT832(0) << 0x40;
                if (-1 < (long)*(int *)&pAVar26->_vptr_Allocator) {
                  auVar47 = *(undefined1 (*) [32])
                             ((long)pvVar11 + (long)*(int *)&pAVar26->_vptr_Allocator * 4 + lVar28);
                }
                lVar34 = (long)*(int *)((long)&pAVar26->_vptr_Allocator + 4);
                if (-1 < lVar34) {
                  auVar48 = *(undefined1 (*) [32])((long)pvVar11 + lVar34 * 4 + lVar28);
                }
                auVar53 = ZEXT1632(ZEXT816(0) << 0x40);
                auVar52 = ZEXT832(0) << 0x40;
                if (-1 < (long)*(int *)&pAVar26[1]._vptr_Allocator) {
                  auVar52 = *(undefined1 (*) [32])
                             ((long)pvVar11 + (long)*(int *)&pAVar26[1]._vptr_Allocator * 4 + lVar28
                             );
                }
                lVar34 = (long)*(int *)((long)&pAVar26[1]._vptr_Allocator + 4);
                if (-1 < lVar34) {
                  auVar53 = *(undefined1 (*) [32])((long)pvVar11 + lVar34 * 4 + lVar28);
                }
                uVar2 = *(undefined4 *)&pAVar26[2]._vptr_Allocator;
                auVar60._4_4_ = uVar2;
                auVar60._0_4_ = uVar2;
                auVar60._8_4_ = uVar2;
                auVar60._12_4_ = uVar2;
                auVar60._16_4_ = uVar2;
                auVar60._20_4_ = uVar2;
                auVar60._24_4_ = uVar2;
                auVar60._28_4_ = uVar2;
                auVar42 = vfmsub231ps_fma(auVar47,auVar60,auVar47);
                auVar42 = vfmsub213ps_fma(auVar48,auVar60,ZEXT1632(auVar42));
                auVar39 = vfmsub231ps_fma(auVar52,auVar60,auVar52);
                auVar39 = vfnmadd231ps_fma(ZEXT1632(auVar39),auVar60,auVar53);
                uVar2 = *(undefined4 *)((long)&pAVar26[2]._vptr_Allocator + 4);
                auVar46._4_4_ = uVar2;
                auVar46._0_4_ = uVar2;
                auVar46._8_4_ = uVar2;
                auVar46._12_4_ = uVar2;
                auVar46._16_4_ = uVar2;
                auVar46._20_4_ = uVar2;
                auVar46._24_4_ = uVar2;
                auVar46._28_4_ = uVar2;
                auVar42 = vfmsub231ps_fma(ZEXT1632(auVar42),auVar46,ZEXT1632(auVar42));
                auVar42 = vfnmsub231ps_fma(ZEXT1632(auVar42),auVar46,ZEXT1632(auVar39));
                *pauVar30 = ZEXT1632(auVar42);
                pauVar30 = pauVar30 + 1;
                pAVar26 = pAVar26 + 3;
              }
            }
          }
          goto LAB_0052b005;
        }
      }
      else {
        if (!bVar36) goto LAB_0052b005;
        iVar22 = (this->super_GridSample).sample_type;
        if (iVar22 != 2) {
          if (iVar22 == 1) {
            iVar22 = this_00->h * this_00->w * this_00->d;
            uVar23 = 0;
            if (iVar22 < 1) {
              iVar22 = 0;
            }
            uVar25 = (ulong)(uint)this_00->c;
            if (this_00->c < 1) {
              uVar25 = uVar23;
            }
            for (; uVar23 != uVar25; uVar23 = uVar23 + 1) {
              lVar28 = src->cstep * uVar23 * src->elemsize;
              pvVar11 = src->data;
              pauVar30 = (undefined1 (*) [32])
                         (this_00->cstep * uVar23 * this_00->elemsize + (long)this_00->data);
              pAVar26 = (Allocator *)local_440._0_8_;
              iVar33 = iVar22;
              while (bVar36 = iVar33 != 0, iVar33 = iVar33 + -1, bVar36) {
                auVar48 = ZEXT832(0) << 0x40;
                auVar47 = ZEXT832(0) << 0x40;
                if (-1 < (long)*(int *)&pAVar26->_vptr_Allocator) {
                  auVar47 = *(undefined1 (*) [32])
                             ((long)pvVar11 + (long)*(int *)&pAVar26->_vptr_Allocator * 4 + lVar28);
                }
                lVar34 = (long)*(int *)((long)&pAVar26->_vptr_Allocator + 4);
                if (-1 < lVar34) {
                  auVar48 = *(undefined1 (*) [32])((long)pvVar11 + lVar34 * 4 + lVar28);
                }
                auVar53 = ZEXT832(0) << 0x40;
                auVar52 = ZEXT832(0) << 0x40;
                if (-1 < (long)*(int *)&pAVar26[1]._vptr_Allocator) {
                  auVar52 = *(undefined1 (*) [32])
                             ((long)pvVar11 + (long)*(int *)&pAVar26[1]._vptr_Allocator * 4 + lVar28
                             );
                }
                lVar34 = (long)*(int *)((long)&pAVar26[1]._vptr_Allocator + 4);
                if (-1 < lVar34) {
                  auVar53 = *(undefined1 (*) [32])((long)pvVar11 + lVar34 * 4 + lVar28);
                }
                auVar56 = ZEXT832(0) << 0x40;
                auVar63 = ZEXT832(0) << 0x40;
                if (-1 < (long)*(int *)&pAVar26[2]._vptr_Allocator) {
                  auVar63 = *(undefined1 (*) [32])
                             ((long)pvVar11 + (long)*(int *)&pAVar26[2]._vptr_Allocator * 4 + lVar28
                             );
                }
                lVar34 = (long)*(int *)((long)&pAVar26[2]._vptr_Allocator + 4);
                if (-1 < lVar34) {
                  auVar56 = *(undefined1 (*) [32])((long)pvVar11 + lVar34 * 4 + lVar28);
                }
                auVar69 = ZEXT1632(ZEXT816(0) << 0x40);
                auVar66 = ZEXT832(0) << 0x40;
                if (-1 < (long)*(int *)&pAVar26[3]._vptr_Allocator) {
                  auVar66 = *(undefined1 (*) [32])
                             ((long)pvVar11 + (long)*(int *)&pAVar26[3]._vptr_Allocator * 4 + lVar28
                             );
                }
                lVar34 = (long)*(int *)((long)&pAVar26[3]._vptr_Allocator + 4);
                if (-1 < lVar34) {
                  auVar69 = *(undefined1 (*) [32])((long)pvVar11 + lVar34 * 4 + lVar28);
                }
                uVar2 = *(undefined4 *)&pAVar26[4]._vptr_Allocator;
                auVar73._4_4_ = uVar2;
                auVar73._0_4_ = uVar2;
                auVar73._8_4_ = uVar2;
                auVar73._12_4_ = uVar2;
                auVar73._16_4_ = uVar2;
                auVar73._20_4_ = uVar2;
                auVar73._24_4_ = uVar2;
                auVar73._28_4_ = uVar2;
                auVar42 = vfmsub231ps_fma(auVar47,auVar73,auVar47);
                auVar42 = vfmsub213ps_fma(auVar48,auVar73,ZEXT1632(auVar42));
                auVar39 = vfmsub231ps_fma(auVar52,auVar73,auVar52);
                auVar51 = vfnmadd213ps_fma(auVar53,auVar73,ZEXT1632(auVar39));
                auVar39 = vfmsub231ps_fma(auVar63,auVar73,auVar63);
                auVar39 = vfmsub213ps_fma(auVar56,auVar73,ZEXT1632(auVar39));
                auVar45 = vfmsub231ps_fma(auVar66,auVar73,auVar66);
                uVar2 = *(undefined4 *)((long)&pAVar26[4]._vptr_Allocator + 4);
                auVar47._4_4_ = uVar2;
                auVar47._0_4_ = uVar2;
                auVar47._8_4_ = uVar2;
                auVar47._12_4_ = uVar2;
                auVar47._16_4_ = uVar2;
                auVar47._20_4_ = uVar2;
                auVar47._24_4_ = uVar2;
                auVar47._28_4_ = uVar2;
                auVar45 = vfnmadd231ps_fma(ZEXT1632(auVar45),auVar73,auVar69);
                auVar42 = vfmsub231ps_fma(ZEXT1632(auVar42),auVar47,ZEXT1632(auVar42));
                auVar51 = vfnmsub231ps_fma(ZEXT1632(auVar42),auVar47,ZEXT1632(auVar51));
                auVar42 = vfmsub231ps_fma(ZEXT1632(auVar39),auVar47,ZEXT1632(auVar39));
                auVar42 = vfmadd231ps_fma(ZEXT1632(auVar42),auVar47,ZEXT1632(auVar45));
                uVar2 = *(undefined4 *)&pAVar26[5]._vptr_Allocator;
                auVar48._4_4_ = uVar2;
                auVar48._0_4_ = uVar2;
                auVar48._8_4_ = uVar2;
                auVar48._12_4_ = uVar2;
                auVar48._16_4_ = uVar2;
                auVar48._20_4_ = uVar2;
                auVar48._24_4_ = uVar2;
                auVar48._28_4_ = uVar2;
                auVar39 = vfmsub231ps_fma(ZEXT1632(auVar51),auVar48,ZEXT1632(auVar51));
                auVar42 = vfnmsub231ps_fma(ZEXT1632(auVar39),auVar48,ZEXT1632(auVar42));
                *pauVar30 = ZEXT1632(auVar42);
                pauVar30 = pauVar30 + 1;
                pAVar26 = (Allocator *)((long)&pAVar26[5]._vptr_Allocator + 4);
              }
            }
          }
          goto LAB_0052b005;
        }
      }
      gridsample_nearest_apply_interpolation_p8(src,this_00,(Mat *)local_440,opt_00);
      goto LAB_0052b005;
    }
    local_3f8 = 0;
    if (iVar33 == 3) {
      iVar22 = (this->super_GridSample).sample_type;
      if (iVar22 == 3) {
        iVar22 = this_00->h * this_00->w;
        pAVar26 = (Allocator *)0x0;
        if (iVar22 < 1) {
          iVar22 = 0;
        }
        local_398 = (Allocator *)(ulong)(uint)this_00->c;
        if (this_00->c < 1) {
          local_398 = pAVar26;
        }
        while (pAVar26 != local_398) {
          lVar28 = src->cstep * (long)pAVar26 * src->elemsize;
          pvVar11 = src->data;
          pauVar31 = (undefined1 (*) [16])
                     (this_00->cstep * (long)pAVar26 * this_00->elemsize + (long)this_00->data);
          pAVar27 = (Allocator *)local_440._0_8_;
          local_3a0 = pAVar26;
          for (iVar33 = 0; iVar33 != iVar22; iVar33 = iVar33 + 1) {
            local_390 = *(float *)&pAVar27->_vptr_Allocator;
            fStack_38c = local_390;
            fStack_388 = local_390;
            fStack_384 = local_390;
            cubic_interp1d_p4((__m128 *)&local_1c0,(__m128 *)&local_200,(__m128 *)&local_240,
                              (__m128 *)&local_280,(__m128 *)&local_390);
            local_390 = *(float *)((long)&pAVar27->_vptr_Allocator + 4);
            fStack_38c = local_390;
            fStack_388 = local_390;
            fStack_384 = local_390;
            cubic_interp1d_p4((__m128 *)&local_2c0,(__m128 *)&local_300,(__m128 *)&local_340,
                              (__m128 *)&local_380,(__m128 *)&local_390);
            auVar55._4_12_ = auStack_1fc;
            auVar55._0_4_ = local_200;
            auVar51._4_12_ = auStack_23c;
            auVar51._0_4_ = local_240;
            auVar42._4_12_ = auStack_27c;
            auVar42._0_4_ = local_280;
            for (lVar34 = 0; lVar34 != 0x40; lVar34 = lVar34 + 0x10) {
              lVar24 = (long)*(int *)((long)&pAVar27[1]._vptr_Allocator + lVar34);
              auVar39 = ZEXT816(0) << 0x40;
              fVar50 = 0.0;
              fVar58 = 0.0;
              fVar65 = 0.0;
              fVar71 = 0.0;
              if (-1 < lVar24) {
                pfVar1 = (float *)((long)pvVar11 + lVar24 * 4 + lVar28);
                fVar50 = *pfVar1;
                fVar58 = pfVar1[1];
                fVar65 = pfVar1[2];
                fVar71 = pfVar1[3];
              }
              lVar24 = (long)*(int *)((long)&pAVar27[1]._vptr_Allocator + lVar34 + 4);
              if (-1 < lVar24) {
                auVar39 = *(undefined1 (*) [16])((long)pvVar11 + lVar24 * 4 + lVar28);
              }
              lVar24 = (long)*(int *)((long)&pAVar27[2]._vptr_Allocator + lVar34);
              auVar44 = ZEXT816(0) << 0x40;
              auVar45 = ZEXT816(0) << 0x40;
              if (-1 < lVar24) {
                auVar45 = *(undefined1 (*) [16])((long)pvVar11 + lVar24 * 4 + lVar28);
              }
              lVar24 = (long)*(int *)((long)&pAVar27[2]._vptr_Allocator + lVar34 + 4);
              if (-1 < lVar24) {
                auVar44 = *(undefined1 (*) [16])((long)pvVar11 + lVar24 * 4 + lVar28);
              }
              auVar62._0_4_ = fVar50 * local_1c0;
              auVar62._4_4_ = fVar58 * fStack_1bc;
              auVar62._8_4_ = fVar65 * fStack_1b8;
              auVar62._12_4_ = fVar71 * fStack_1b4;
              auVar39 = vfmadd213ps_fma(auVar39,auVar55,auVar62);
              auVar39 = vfmadd213ps_fma(auVar45,auVar51,auVar39);
              auVar39 = vfmadd231ps_fma(auVar39,auVar42,auVar44);
              *(undefined1 (*) [16])(local_180 + lVar34) = auVar39;
            }
            auVar40._0_4_ = (float)local_180._0_4_ * local_2c0;
            auVar40._4_4_ = (float)local_180._4_4_ * fStack_2bc;
            auVar40._8_4_ = (float)local_180._8_4_ * fStack_2b8;
            auVar40._12_4_ = (float)local_180._12_4_ * fStack_2b4;
            auVar18._4_12_ = auStack_2fc;
            auVar18._0_4_ = local_300;
            auVar42 = vfmadd132ps_fma(auVar18,auVar40,stack0xfffffffffffffe90);
            auVar17._4_12_ = auStack_33c;
            auVar17._0_4_ = local_340;
            auVar42 = vfmadd132ps_fma(auVar17,auVar42,auStack_160._0_16_);
            auVar68._4_12_ = auStack_37c;
            auVar68._0_4_ = local_380;
            auVar42 = vfmadd132ps_fma(auVar68,auVar42,auStack_160._16_16_);
            *pauVar31 = auVar42;
            pauVar31 = pauVar31 + 1;
            pAVar27 = pAVar27 + 9;
          }
          pAVar26 = (Allocator *)((long)&local_3a0->_vptr_Allocator + 1);
        }
        goto LAB_0052b005;
      }
      if (iVar22 != 2) {
        if (iVar22 == 1) {
          iVar22 = this_00->h * this_00->w;
          uVar23 = 0;
          if (iVar22 < 1) {
            iVar22 = 0;
          }
          uVar25 = (ulong)(uint)this_00->c;
          if (this_00->c < 1) {
            uVar25 = uVar23;
          }
          for (; uVar23 != uVar25; uVar23 = uVar23 + 1) {
            lVar28 = src->cstep * uVar23 * src->elemsize;
            pvVar11 = src->data;
            pauVar31 = (undefined1 (*) [16])
                       (this_00->cstep * uVar23 * this_00->elemsize + (long)this_00->data);
            pAVar26 = (Allocator *)local_440._0_8_;
            iVar33 = iVar22;
            while (bVar36 = iVar33 != 0, iVar33 = iVar33 + -1, bVar36) {
              auVar39 = ZEXT816(0) << 0x40;
              auVar42 = ZEXT816(0) << 0x40;
              if (-1 < (long)*(int *)&pAVar26->_vptr_Allocator) {
                auVar42 = *(undefined1 (*) [16])
                           ((long)pvVar11 + (long)*(int *)&pAVar26->_vptr_Allocator * 4 + lVar28);
              }
              lVar34 = (long)*(int *)((long)&pAVar26->_vptr_Allocator + 4);
              if (-1 < lVar34) {
                auVar39 = *(undefined1 (*) [16])((long)pvVar11 + lVar34 * 4 + lVar28);
              }
              auVar51 = ZEXT816(0) << 0x40;
              auVar45 = ZEXT816(0) << 0x40;
              if (-1 < (long)*(int *)&pAVar26[1]._vptr_Allocator) {
                auVar45 = *(undefined1 (*) [16])
                           ((long)pvVar11 + (long)*(int *)&pAVar26[1]._vptr_Allocator * 4 + lVar28);
              }
              lVar34 = (long)*(int *)((long)&pAVar26[1]._vptr_Allocator + 4);
              if (-1 < lVar34) {
                auVar51 = *(undefined1 (*) [16])((long)pvVar11 + lVar34 * 4 + lVar28);
              }
              uVar2 = *(undefined4 *)&pAVar26[2]._vptr_Allocator;
              auVar59._4_4_ = uVar2;
              auVar59._0_4_ = uVar2;
              auVar59._8_4_ = uVar2;
              auVar59._12_4_ = uVar2;
              auVar42 = vfmsub231ps_fma(auVar42,auVar59,auVar42);
              auVar42 = vfmsub213ps_fma(auVar39,auVar59,auVar42);
              auVar39 = vfmsub231ps_fma(auVar45,auVar59,auVar45);
              auVar39 = vfnmadd231ps_fma(auVar39,auVar59,auVar51);
              uVar2 = *(undefined4 *)((long)&pAVar26[2]._vptr_Allocator + 4);
              auVar43._4_4_ = uVar2;
              auVar43._0_4_ = uVar2;
              auVar43._8_4_ = uVar2;
              auVar43._12_4_ = uVar2;
              auVar42 = vfmsub231ps_fma(auVar42,auVar43,auVar42);
              auVar42 = vfnmsub231ps_fma(auVar42,auVar43,auVar39);
              *pauVar31 = auVar42;
              pauVar31 = pauVar31 + 1;
              pAVar26 = pAVar26 + 3;
            }
          }
        }
        goto LAB_0052b005;
      }
    }
    else {
      if (!bVar36) goto LAB_0052b005;
      iVar22 = (this->super_GridSample).sample_type;
      if (iVar22 != 2) {
        if (iVar22 == 1) {
          iVar22 = this_00->h * this_00->w * this_00->d;
          uVar23 = 0;
          if (iVar22 < 1) {
            iVar22 = 0;
          }
          uVar25 = (ulong)(uint)this_00->c;
          if (this_00->c < 1) {
            uVar25 = uVar23;
          }
          for (; uVar23 != uVar25; uVar23 = uVar23 + 1) {
            lVar28 = src->cstep * uVar23 * src->elemsize;
            pvVar11 = src->data;
            pauVar31 = (undefined1 (*) [16])
                       (this_00->cstep * uVar23 * this_00->elemsize + (long)this_00->data);
            pAVar26 = (Allocator *)local_440._0_8_;
            iVar33 = iVar22;
            while (bVar36 = iVar33 != 0, iVar33 = iVar33 + -1, bVar36) {
              auVar39 = ZEXT816(0) << 0x40;
              auVar42 = ZEXT816(0) << 0x40;
              if (-1 < (long)*(int *)&pAVar26->_vptr_Allocator) {
                auVar42 = *(undefined1 (*) [16])
                           ((long)pvVar11 + (long)*(int *)&pAVar26->_vptr_Allocator * 4 + lVar28);
              }
              lVar34 = (long)*(int *)((long)&pAVar26->_vptr_Allocator + 4);
              if (-1 < lVar34) {
                auVar39 = *(undefined1 (*) [16])((long)pvVar11 + lVar34 * 4 + lVar28);
              }
              auVar51 = ZEXT816(0) << 0x40;
              auVar45 = ZEXT816(0) << 0x40;
              if (-1 < (long)*(int *)&pAVar26[1]._vptr_Allocator) {
                auVar45 = *(undefined1 (*) [16])
                           ((long)pvVar11 + (long)*(int *)&pAVar26[1]._vptr_Allocator * 4 + lVar28);
              }
              lVar34 = (long)*(int *)((long)&pAVar26[1]._vptr_Allocator + 4);
              if (-1 < lVar34) {
                auVar51 = *(undefined1 (*) [16])((long)pvVar11 + lVar34 * 4 + lVar28);
              }
              auVar55 = ZEXT816(0) << 0x40;
              auVar44 = ZEXT816(0) << 0x40;
              if (-1 < (long)*(int *)&pAVar26[2]._vptr_Allocator) {
                auVar44 = *(undefined1 (*) [16])
                           ((long)pvVar11 + (long)*(int *)&pAVar26[2]._vptr_Allocator * 4 + lVar28);
              }
              lVar34 = (long)*(int *)((long)&pAVar26[2]._vptr_Allocator + 4);
              if (-1 < lVar34) {
                auVar55 = *(undefined1 (*) [16])((long)pvVar11 + lVar34 * 4 + lVar28);
              }
              auVar68 = ZEXT816(0) << 0x40;
              auVar62 = ZEXT816(0) << 0x40;
              if (-1 < (long)*(int *)&pAVar26[3]._vptr_Allocator) {
                auVar62 = *(undefined1 (*) [16])
                           ((long)pvVar11 + (long)*(int *)&pAVar26[3]._vptr_Allocator * 4 + lVar28);
              }
              lVar34 = (long)*(int *)((long)&pAVar26[3]._vptr_Allocator + 4);
              if (-1 < lVar34) {
                auVar68 = *(undefined1 (*) [16])((long)pvVar11 + lVar34 * 4 + lVar28);
              }
              uVar2 = *(undefined4 *)&pAVar26[4]._vptr_Allocator;
              auVar72._4_4_ = uVar2;
              auVar72._0_4_ = uVar2;
              auVar72._8_4_ = uVar2;
              auVar72._12_4_ = uVar2;
              auVar42 = vfmsub231ps_fma(auVar42,auVar72,auVar42);
              auVar42 = vfmsub213ps_fma(auVar39,auVar72,auVar42);
              auVar39 = vfmsub231ps_fma(auVar45,auVar72,auVar45);
              auVar51 = vfnmadd213ps_fma(auVar51,auVar72,auVar39);
              auVar39 = vfmsub231ps_fma(auVar44,auVar72,auVar44);
              auVar39 = vfmsub213ps_fma(auVar55,auVar72,auVar39);
              auVar45 = vfmsub231ps_fma(auVar62,auVar72,auVar62);
              uVar2 = *(undefined4 *)((long)&pAVar26[4]._vptr_Allocator + 4);
              auVar44._4_4_ = uVar2;
              auVar44._0_4_ = uVar2;
              auVar44._8_4_ = uVar2;
              auVar44._12_4_ = uVar2;
              auVar45 = vfnmadd231ps_fma(auVar45,auVar72,auVar68);
              auVar42 = vfmsub231ps_fma(auVar42,auVar44,auVar42);
              auVar51 = vfnmsub231ps_fma(auVar42,auVar44,auVar51);
              auVar42 = vfmsub231ps_fma(auVar39,auVar44,auVar39);
              auVar42 = vfmadd231ps_fma(auVar42,auVar44,auVar45);
              uVar2 = *(undefined4 *)&pAVar26[5]._vptr_Allocator;
              auVar45._4_4_ = uVar2;
              auVar45._0_4_ = uVar2;
              auVar45._8_4_ = uVar2;
              auVar45._12_4_ = uVar2;
              auVar39 = vfmsub231ps_fma(auVar51,auVar45,auVar51);
              auVar42 = vfnmsub231ps_fma(auVar39,auVar45,auVar42);
              *pauVar31 = auVar42;
              pauVar31 = pauVar31 + 1;
              pAVar26 = (Allocator *)((long)&pAVar26[5]._vptr_Allocator + 4);
            }
          }
        }
        goto LAB_0052b005;
      }
    }
    gridsample_nearest_apply_interpolation_p4(src,this_00,(Mat *)local_440,opt_00);
    goto LAB_0052b005;
  }
  local_3f8 = 0;
  if (iVar33 == 3) {
    iVar22 = (this->super_GridSample).sample_type;
    if (iVar22 == 3) {
      iVar22 = this_00->h * this_00->w;
      pvVar11 = src->data;
      sVar9 = src->elemsize;
      sVar12 = src->cstep;
      pvVar32 = this_00->data;
      sVar13 = this_00->elemsize;
      sVar14 = this_00->cstep;
      local_3a0 = (Allocator *)local_440._0_8_;
      if (iVar22 < 1) {
        iVar22 = 0;
      }
      local_3f8 = 0;
      uVar23 = (ulong)(uint)this_00->c;
      if (this_00->c < 1) {
        uVar23 = 0;
      }
      for (uVar25 = 0; uVar25 != uVar23; uVar25 = uVar25 + 1) {
        lVar28 = sVar9 * sVar12 * uVar25;
        puVar35 = (undefined4 *)(sVar13 * sVar14 * uVar25 + (long)pvVar32);
        pAVar26 = local_3a0;
        for (iVar33 = 0; iVar33 != iVar22; iVar33 = iVar33 + 1) {
          cubic_interp1d(&local_1c0,&local_200,&local_240,&local_280,
                         *(float *)&pAVar26->_vptr_Allocator);
          cubic_interp1d(&local_2c0,&local_300,&local_340,&local_380,
                         *(float *)((long)&pAVar26->_vptr_Allocator + 4));
          for (lVar34 = 2; lVar34 != 0x12; lVar34 = lVar34 + 4) {
            lVar24 = (long)*(int *)((long)&pAVar26->_vptr_Allocator + lVar34 * 4);
            auVar42 = ZEXT816(0) << 0x40;
            fVar50 = 0.0;
            if (-1 < lVar24) {
              fVar50 = *(float *)((long)pvVar11 + lVar24 * 4 + lVar28);
            }
            lVar24 = (long)*(int *)((long)&pAVar26->_vptr_Allocator + lVar34 * 4 + 4);
            if (-1 < lVar24) {
              auVar42 = ZEXT416(*(uint *)((long)pvVar11 + lVar24 * 4 + lVar28));
            }
            lVar24 = (long)*(int *)((long)&pAVar26[1]._vptr_Allocator + lVar34 * 4);
            auVar45 = ZEXT816(0) << 0x40;
            auVar39 = ZEXT816(0) << 0x40;
            if (-1 < lVar24) {
              auVar39 = ZEXT416(*(uint *)((long)pvVar11 + lVar24 * 4 + lVar28));
            }
            lVar24 = (long)*(int *)((long)&pAVar26[1]._vptr_Allocator + lVar34 * 4 + 4);
            if (-1 < lVar24) {
              auVar45 = ZEXT416(*(uint *)((long)pvVar11 + lVar24 * 4 + lVar28));
            }
            auVar42 = vfmadd213ss_fma(auVar42,ZEXT416((uint)local_200),
                                      ZEXT416((uint)(fVar50 * local_1c0)));
            auVar42 = vfmadd213ss_fma(auVar39,ZEXT416((uint)local_240),auVar42);
            auVar42 = vfmadd231ss_fma(auVar42,ZEXT416((uint)local_280),auVar45);
            *(int *)(auStack_1a4 + lVar34 + 0x22) = auVar42._0_4_;
          }
          auVar42 = vinsertps_avx(ZEXT416((uint)local_2c0),ZEXT416((uint)local_300),0x10);
          auVar42 = vinsertps_avx(auVar42,ZEXT416((uint)local_340),0x20);
          auVar42 = vinsertps_avx(auVar42,ZEXT416((uint)local_380),0x30);
          auVar39._0_4_ = auVar42._0_4_ * (float)local_180._0_4_;
          auVar39._4_4_ = auVar42._4_4_ * (float)local_180._4_4_;
          auVar39._8_4_ = auVar42._8_4_ * (float)local_180._8_4_;
          auVar39._12_4_ = auVar42._12_4_ * (float)local_180._12_4_;
          auVar42 = vhaddps_avx(auVar39,auVar39);
          auVar42 = vhaddps_avx(auVar42,auVar42);
          *puVar35 = auVar42._0_4_;
          puVar35 = puVar35 + 1;
          pAVar26 = pAVar26 + 9;
        }
      }
      goto LAB_0052b005;
    }
    if (iVar22 != 2) {
      if (iVar22 == 1) {
        iVar22 = this_00->h * this_00->w;
        pvVar11 = src->data;
        sVar9 = src->elemsize;
        sVar12 = src->cstep;
        pvVar32 = this_00->data;
        sVar13 = this_00->elemsize;
        sVar14 = this_00->cstep;
        if (iVar22 < 1) {
          iVar22 = 0;
        }
        local_3f8 = 0;
        uVar23 = (ulong)(uint)this_00->c;
        if (this_00->c < 1) {
          uVar23 = 0;
        }
        for (uVar25 = 0; uVar25 != uVar23; uVar25 = uVar25 + 1) {
          lVar34 = sVar9 * sVar12 * uVar25;
          pAVar26 = (Allocator *)local_440._0_8_;
          for (lVar28 = 0; iVar22 != (int)lVar28; lVar28 = lVar28 + 1) {
            fVar50 = 0.0;
            auVar42 = ZEXT816(0) << 0x40;
            if (-1 < (long)*(int *)&pAVar26->_vptr_Allocator) {
              auVar42 = ZEXT416(*(uint *)((long)pvVar11 +
                                         (long)*(int *)&pAVar26->_vptr_Allocator * 4 + lVar34));
            }
            lVar24 = (long)*(int *)((long)&pAVar26->_vptr_Allocator + 4);
            if (-1 < lVar24) {
              fVar50 = *(float *)((long)pvVar11 + lVar24 * 4 + lVar34);
            }
            fVar58 = 0.0;
            auVar39 = ZEXT816(0) << 0x40;
            if (-1 < (long)*(int *)&pAVar26[1]._vptr_Allocator) {
              auVar39 = ZEXT416(*(uint *)((long)pvVar11 +
                                         (long)*(int *)&pAVar26[1]._vptr_Allocator * 4 + lVar34));
            }
            lVar24 = (long)*(int *)((long)&pAVar26[1]._vptr_Allocator + 4);
            if (-1 < lVar24) {
              fVar58 = *(float *)((long)pvVar11 + lVar24 * 4 + lVar34);
            }
            fVar65 = *(float *)&pAVar26[2]._vptr_Allocator;
            auVar42 = vfmadd213ss_fma(auVar42,ZEXT416((uint)(1.0 - fVar65)),
                                      ZEXT416((uint)(fVar65 * fVar50)));
            auVar39 = vfmadd213ss_fma(auVar39,ZEXT416((uint)(1.0 - fVar65)),
                                      ZEXT416((uint)(fVar65 * fVar58)));
            auVar42 = vfmadd132ss_fma(ZEXT416((uint)(auVar39._0_4_ - auVar42._0_4_)),auVar42,
                                      ZEXT416(*(uint *)((long)&pAVar26[2]._vptr_Allocator + 4)));
            *(int *)((long)pvVar32 + lVar28 * 4) = auVar42._0_4_;
            pAVar26 = pAVar26 + 3;
          }
          pvVar32 = (void *)((long)pvVar32 + sVar13 * sVar14);
        }
      }
      goto LAB_0052b005;
    }
  }
  else {
    if (!bVar36) goto LAB_0052b005;
    iVar22 = (this->super_GridSample).sample_type;
    if (iVar22 != 2) {
      if (iVar22 == 1) {
        iVar22 = this_00->h * this_00->w * this_00->d;
        pvVar11 = src->data;
        sVar9 = src->elemsize;
        sVar12 = src->cstep;
        pvVar32 = this_00->data;
        sVar13 = this_00->elemsize;
        sVar14 = this_00->cstep;
        if (iVar22 < 1) {
          iVar22 = 0;
        }
        local_3f8 = 0;
        uVar23 = (ulong)(uint)this_00->c;
        if (this_00->c < 1) {
          uVar23 = 0;
        }
        for (uVar25 = 0; uVar25 != uVar23; uVar25 = uVar25 + 1) {
          lVar34 = sVar9 * sVar12 * uVar25;
          pAVar26 = (Allocator *)local_440._0_8_;
          for (lVar28 = 0; iVar22 != (int)lVar28; lVar28 = lVar28 + 1) {
            fVar50 = 0.0;
            auVar42 = ZEXT816(0) << 0x40;
            if (-1 < (long)*(int *)&pAVar26->_vptr_Allocator) {
              auVar42 = ZEXT416(*(uint *)((long)pvVar11 +
                                         (long)*(int *)&pAVar26->_vptr_Allocator * 4 + lVar34));
            }
            lVar24 = (long)*(int *)((long)&pAVar26->_vptr_Allocator + 4);
            if (-1 < lVar24) {
              fVar50 = *(float *)((long)pvVar11 + lVar24 * 4 + lVar34);
            }
            fVar58 = 0.0;
            auVar39 = ZEXT816(0) << 0x40;
            if (-1 < (long)*(int *)&pAVar26[1]._vptr_Allocator) {
              auVar39 = ZEXT416(*(uint *)((long)pvVar11 +
                                         (long)*(int *)&pAVar26[1]._vptr_Allocator * 4 + lVar34));
            }
            lVar24 = (long)*(int *)((long)&pAVar26[1]._vptr_Allocator + 4);
            if (-1 < lVar24) {
              fVar58 = *(float *)((long)pvVar11 + lVar24 * 4 + lVar34);
            }
            fVar65 = 0.0;
            auVar45 = ZEXT816(0) << 0x40;
            if (-1 < (long)*(int *)&pAVar26[2]._vptr_Allocator) {
              auVar45 = ZEXT416(*(uint *)((long)pvVar11 +
                                         (long)*(int *)&pAVar26[2]._vptr_Allocator * 4 + lVar34));
            }
            lVar24 = (long)*(int *)((long)&pAVar26[2]._vptr_Allocator + 4);
            if (-1 < lVar24) {
              fVar65 = *(float *)((long)pvVar11 + lVar24 * 4 + lVar34);
            }
            fVar71 = 0.0;
            auVar51 = ZEXT816(0) << 0x40;
            if (-1 < (long)*(int *)&pAVar26[3]._vptr_Allocator) {
              auVar51 = ZEXT416(*(uint *)((long)pvVar11 +
                                         (long)*(int *)&pAVar26[3]._vptr_Allocator * 4 + lVar34));
            }
            lVar24 = (long)*(int *)((long)&pAVar26[3]._vptr_Allocator + 4);
            if (-1 < lVar24) {
              fVar71 = *(float *)((long)pvVar11 + lVar24 * 4 + lVar34);
            }
            fVar3 = *(float *)&pAVar26[4]._vptr_Allocator;
            fVar4 = *(float *)((long)&pAVar26[4]._vptr_Allocator + 4);
            fVar15 = 1.0 - fVar3;
            auVar42 = vfmadd213ss_fma(auVar42,ZEXT416((uint)fVar15),ZEXT416((uint)(fVar3 * fVar50)))
            ;
            auVar39 = vfmadd213ss_fma(auVar39,ZEXT416((uint)fVar15),ZEXT416((uint)(fVar3 * fVar58)))
            ;
            auVar45 = vfmadd213ss_fma(auVar45,ZEXT416((uint)fVar15),ZEXT416((uint)(fVar3 * fVar65)))
            ;
            auVar51 = vfmadd213ss_fma(auVar51,ZEXT416((uint)fVar15),ZEXT416((uint)(fVar3 * fVar71)))
            ;
            auVar42 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * auVar39._0_4_)),
                                      ZEXT416((uint)(1.0 - fVar4)),auVar42);
            auVar39 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * auVar51._0_4_)),
                                      ZEXT416((uint)(1.0 - fVar4)),auVar45);
            auVar42 = vfmadd132ss_fma(ZEXT416((uint)(auVar39._0_4_ - auVar42._0_4_)),auVar42,
                                      ZEXT416(*(uint *)&pAVar26[5]._vptr_Allocator));
            *(int *)((long)pvVar32 + lVar28 * 4) = auVar42._0_4_;
            pAVar26 = (Allocator *)((long)&pAVar26[5]._vptr_Allocator + 4);
          }
          pvVar32 = (void *)((long)pvVar32 + sVar13 * sVar14);
        }
      }
      goto LAB_0052b005;
    }
  }
  gridsample_nearest_apply_interpolation_p1(src,this_00,(Mat *)local_440,opt_00);
LAB_0052b005:
  piVar10 = (int *)CONCAT44(local_3f0.refcount._4_4_,(int)local_3f0.refcount);
  if (piVar10 != (int *)0x0) {
    LOCK();
    *piVar10 = *piVar10 + -1;
    UNLOCK();
    if (*piVar10 == 0) {
      if (local_3f0.allocator == (Allocator *)0x0) {
        free(local_3f0.data);
      }
      else {
        (*(local_3f0.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar10 = (int *)CONCAT44(local_440._12_4_,local_440._8_4_);
  if (piVar10 != (int *)0x0) {
    LOCK();
    *piVar10 = *piVar10 + -1;
    UNLOCK();
    if (*piVar10 == 0) {
      if (local_420 == (Allocator *)0x0) {
        free((void *)local_440._0_8_);
      }
      else {
        (*local_420->_vptr_Allocator[3])();
      }
    }
  }
  return (int)local_3f8;
}

Assistant:

int GridSample_x86_avx512::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& grid = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];
    int elempack = bottom_blob.elempack;

    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    int outw, outh, outd;
    Mat offset_value_blob;

    Mat grid_p1;
    if (grid.elempack != 1)
    {
        convert_packing(grid, grid_p1, 1, opt);
    }
    else
    {
        grid_p1 = grid;
    }

    if (dims == 3)
    {
        outw = permute_fusion == 0 ? grid_p1.h : grid_p1.w;
        outh = permute_fusion == 0 ? grid_p1.c : grid_p1.h;

        top_blob.create(outw, outh, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (sample_type == GridSample::Interpolation_BILINEAR)
        {
            offset_value_blob.create(outw, outh, elemsize * 6, 6, opt.workspace_allocator);
            if (offset_value_blob.empty())
                return -100;

            if (padding_mode == GridSample::Padding_ZEROS)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_bilinear_compute_blob<GridSample::Padding_ZEROS, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_bilinear_compute_blob<GridSample::Padding_ZEROS, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_BORDER)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_bilinear_compute_blob<GridSample::Padding_BORDER, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_bilinear_compute_blob<GridSample::Padding_BORDER, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_REFLECTION)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_bilinear_compute_blob<GridSample::Padding_REFLECTION, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_bilinear_compute_blob<GridSample::Padding_REFLECTION, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else
            {
                NCNN_LOGE("gridsample padding_mode error\n");
                return -100;
            }
        }

        if (sample_type == GridSample::Interpolation_NEAREST)
        {
            offset_value_blob.create(outw, outh, 1, elemsize, 1, opt.workspace_allocator);
            if (offset_value_blob.empty())
                return -100;

            if (padding_mode == GridSample::Padding_ZEROS)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_nearest_compute_blob<GridSample::Padding_ZEROS, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_nearest_compute_blob<GridSample::Padding_ZEROS, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_BORDER)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_nearest_compute_blob<GridSample::Padding_BORDER, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_nearest_compute_blob<GridSample::Padding_BORDER, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_REFLECTION)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_nearest_compute_blob<GridSample::Padding_REFLECTION, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_nearest_compute_blob<GridSample::Padding_REFLECTION, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else
            {
                NCNN_LOGE("gridsample padding_mode error\n");
                return -100;
            }
        }

        if (sample_type == GridSample::Interpolation_BICUBIC)
        {
            offset_value_blob.create(outw, outh, elemsize * 18, 18, opt.workspace_allocator);
            if (offset_value_blob.empty())
                return -100;

            if (padding_mode == GridSample::Padding_ZEROS)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_bicubic_compute_blob<GridSample::Padding_ZEROS, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_bicubic_compute_blob<GridSample::Padding_ZEROS, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_BORDER)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_bicubic_compute_blob<GridSample::Padding_BORDER, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_bicubic_compute_blob<GridSample::Padding_BORDER, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_REFLECTION)
            {
                if (align_corner == 0)
                {
                    gridsample_2d_bicubic_compute_blob<GridSample::Padding_REFLECTION, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_2d_bicubic_compute_blob<GridSample::Padding_REFLECTION, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else
            {
                NCNN_LOGE("gridsample padding_mode error\n");
                return -100;
            }
        }
    }

    if (dims == 4)
    {
        outw = permute_fusion == 0 ? grid_p1.h : grid_p1.w;
        outh = permute_fusion == 0 ? grid_p1.d : grid_p1.h;
        outd = permute_fusion == 0 ? grid_p1.c : grid_p1.d;

        top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (sample_type == GridSample::Interpolation_BILINEAR)
        {
            offset_value_blob.create(outw, outh, outd, elemsize * 11, 11, opt.workspace_allocator);
            if (offset_value_blob.empty())
                return -100;

            if (padding_mode == GridSample::Padding_ZEROS)
            {
                if (align_corner == 0)
                {
                    gridsample_3d_bilinear_compute_blob<GridSample::Padding_ZEROS, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_3d_bilinear_compute_blob<GridSample::Padding_ZEROS, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_BORDER)
            {
                if (align_corner == 0)
                {
                    gridsample_3d_bilinear_compute_blob<GridSample::Padding_BORDER, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_3d_bilinear_compute_blob<GridSample::Padding_BORDER, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_REFLECTION)
            {
                if (align_corner == 0)
                {
                    gridsample_3d_bilinear_compute_blob<GridSample::Padding_REFLECTION, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_3d_bilinear_compute_blob<GridSample::Padding_REFLECTION, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else
            {
                NCNN_LOGE("gridsample padding_mode error\n");
                return -100;
            }
        }

        if (sample_type == GridSample::Interpolation_NEAREST)
        {
            offset_value_blob.create(outw, outh, outd, 1, elemsize, 1, opt.workspace_allocator);
            if (offset_value_blob.empty())
                return -100;

            if (padding_mode == GridSample::Padding_ZEROS)
            {
                if (align_corner == 0)
                {
                    gridsample_3d_nearest_compute_blob<GridSample::Padding_ZEROS, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_3d_nearest_compute_blob<GridSample::Padding_ZEROS, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_BORDER)
            {
                if (align_corner == 0)
                {
                    gridsample_3d_nearest_compute_blob<GridSample::Padding_BORDER, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_3d_nearest_compute_blob<GridSample::Padding_BORDER, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else if (padding_mode == GridSample::Padding_REFLECTION)
            {
                if (align_corner == 0)
                {
                    gridsample_3d_nearest_compute_blob<GridSample::Padding_REFLECTION, false>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
                else
                {
                    gridsample_3d_nearest_compute_blob<GridSample::Padding_REFLECTION, true>(bottom_blob, grid_p1, offset_value_blob, permute_fusion);
                }
            }
            else
            {
                NCNN_LOGE("gridsample padding_mode error\n");
                return -100;
            }
        }

        if (sample_type == 3)
        {
            NCNN_LOGE("unsupported bicubic when dims == 4");
            return -100;
        }
    }

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        if (dims == 3)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_2d_bilinear_apply_interpolation_p16(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p16(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_BICUBIC)
            {
                gridsample_2d_bicubic_apply_interpolation_p16(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
        else if (dims == 4)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_3d_bilinear_apply_interpolation_p16(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p16(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
    }
#endif // __AVX512F__
    if (elempack == 8)
    {
        if (dims == 3)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_2d_bilinear_apply_interpolation_p8(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p8(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_BICUBIC)
            {
                gridsample_2d_bicubic_apply_interpolation_p8(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
        else if (dims == 4)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_3d_bilinear_apply_interpolation_p8(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p8(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
    }

#endif // __AVX__
    if (elempack == 4)
    {
        if (dims == 3)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_2d_bilinear_apply_interpolation_p4(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p4(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_BICUBIC)
            {
                gridsample_2d_bicubic_apply_interpolation_p4(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
        else if (dims == 4)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_3d_bilinear_apply_interpolation_p4(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p4(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
    }

#endif // __SSE2__

    if (elempack == 1)
    {
        if (dims == 3)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_2d_bilinear_apply_interpolation_p1(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p1(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_BICUBIC)
            {
                gridsample_2d_bicubic_apply_interpolation_p1(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
        else if (dims == 4)
        {
            if (sample_type == GridSample::Interpolation_BILINEAR)
            {
                gridsample_3d_bilinear_apply_interpolation_p1(bottom_blob, top_blob, offset_value_blob, opt);
            }
            else if (sample_type == GridSample::Interpolation_NEAREST)
            {
                gridsample_nearest_apply_interpolation_p1(bottom_blob, top_blob, offset_value_blob, opt);
            }
        }
    }

    return 0;
}